

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int mbedtls_cipher_update_ad(mbedtls_cipher_context_t *ctx,uchar *ad,size_t ad_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  
  pmVar1 = ctx->cipher_info;
  if (pmVar1 == (mbedtls_cipher_info_t *)0x0) {
    iVar2 = -0x6100;
  }
  else {
    if (pmVar1->mode == MBEDTLS_MODE_GCM) {
      iVar2 = mbedtls_gcm_starts((mbedtls_gcm_context *)ctx->cipher_ctx,ctx->operation,ctx->iv,
                                 ctx->iv_size,ad,ad_len);
      return iVar2;
    }
    iVar2 = 0;
    if (pmVar1->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) {
      iVar2 = mbedtls_chachapoly_starts
                        ((mbedtls_chachapoly_context *)ctx->cipher_ctx,ctx->iv,
                         (uint)(ctx->operation != MBEDTLS_ENCRYPT));
      if (iVar2 == 0) {
        iVar2 = mbedtls_chachapoly_update_aad
                          ((mbedtls_chachapoly_context *)ctx->cipher_ctx,ad,ad_len);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_update_ad( mbedtls_cipher_context_t *ctx,
                      const unsigned char *ad, size_t ad_len )
{
    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( ad_len == 0 || ad != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        return( mbedtls_gcm_starts( (mbedtls_gcm_context *) ctx->cipher_ctx, ctx->operation,
                                    ctx->iv, ctx->iv_size, ad, ad_len ) );
    }
#endif

#if defined(MBEDTLS_CHACHAPOLY_C)
    if (MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        int result;
        mbedtls_chachapoly_mode_t mode;

        mode = ( ctx->operation == MBEDTLS_ENCRYPT )
                ? MBEDTLS_CHACHAPOLY_ENCRYPT
                : MBEDTLS_CHACHAPOLY_DECRYPT;

        result = mbedtls_chachapoly_starts( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                                        ctx->iv,
                                                        mode );
        if ( result != 0 )
            return( result );

        return( mbedtls_chachapoly_update_aad( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                               ad, ad_len ) );
    }
#endif

    return( 0 );
}